

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableModel.cpp
# Opt level: O0

QVariant * __thiscall
TableModel::headerData
          (QVariant *__return_storage_ptr__,TableModel *this,int section,Orientation orientation,
          int role)

{
  long lVar1;
  qsizetype qVar2;
  const_reference pQVar3;
  QVariant local_78;
  QVariant local_48;
  undefined1 local_25;
  uint local_24;
  Orientation local_20;
  int role_local;
  Orientation orientation_local;
  int section_local;
  TableModel *this_local;
  QVariant *result;
  
  local_25 = 0;
  local_24 = role;
  local_20 = orientation;
  role_local = section;
  _orientation_local = this;
  this_local = (TableModel *)__return_storage_ptr__;
  QVariant::QVariant(__return_storage_ptr__);
  if (((local_24 & 0xfffffffd) == 0) && ((this->m_supplyHeaderData & 1U) != 0)) {
    if (local_20 == Horizontal) {
      lVar1 = (long)role_local;
      qVar2 = QList<QString>::count(&this->m_horizontalHeaderData);
      if (lVar1 < qVar2) {
        pQVar3 = QList<QString>::operator[](&this->m_horizontalHeaderData,(long)role_local);
        QVariant::QVariant(&local_48,(QString *)pQVar3);
        QVariant::operator=(__return_storage_ptr__,&local_48);
        QVariant::~QVariant(&local_48);
      }
    }
    else {
      lVar1 = (long)role_local;
      qVar2 = QList<QString>::count(&this->m_verticalHeaderData);
      if (lVar1 < qVar2) {
        pQVar3 = QList<QString>::operator[](&this->m_verticalHeaderData,(long)role_local);
        QVariant::QVariant(&local_78,(QString *)pQVar3);
        QVariant::operator=(__return_storage_ptr__,&local_78);
        QVariant::~QVariant(&local_78);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant TableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    QVariant result;

    switch (role) {
    case Qt::DisplayRole:
    case Qt::EditRole:
        if (m_supplyHeaderData) {
            if (orientation == Qt::Horizontal) { // column header data:
                if (section < m_horizontalHeaderData.count())
                    result = m_horizontalHeaderData[section];
            } else {
                // row header data:
                if (section < m_verticalHeaderData.count())
                    result = m_verticalHeaderData[section];
            }
        }
        break;
    // case Qt::TextAlignmentRole:
    //         result = QVariant ( Qt::AlignHCenter | Qt::AlignHCenter );
    // break;
    default:
        break;
    }
    return result;
}